

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_cconv.c
# Opt level: O1

void lj_cconv_bf_tv(CTState *cts,CType *d,uint8_t *dp,TValue *o)

{
  undefined8 in_RAX;
  byte bVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint32_t val;
  uint8_t tmpbool;
  undefined8 local_28;
  
  uVar3 = d->info;
  local_28 = in_RAX;
  if ((uVar3 >> 0x1b & 1) == 0) {
    lj_cconv_ct_tv(cts,(CType *)((long)&cts->tab->info +
                                (ulong)((((uVar3 >> 0x17 & 1) != 0) + 9) * 0x10)),
                   (uint8_t *)&local_28,o,0);
  }
  else {
    lj_cconv_ct_tv(cts,cts->tab + 3,(uint8_t *)((long)&local_28 + 7),o,0);
    uVar2 = (uint)local_28._7_1_;
    local_28 = CONCAT44(local_28._4_4_,uVar2);
  }
  uVar2 = uVar3 >> 8 & 0x7f;
  uVar5 = uVar3 >> 0x10 & 0x7f;
  if (uVar2 + (uVar3 & 0x7f) <= uVar5 * 8) {
    uVar2 = ~(-1 << ((byte)uVar2 & 0x1f));
    bVar1 = (byte)(uVar3 & 0x7f);
    uVar4 = uVar2 << (bVar1 & 0x1f);
    uVar3 = (uVar2 & (uint)local_28) << (bVar1 & 0x1f);
    if (uVar5 == 1) {
      *dp = ~(byte)uVar4 & *dp | (byte)uVar3;
    }
    else if (uVar5 == 2) {
      *(ushort *)dp = ~(ushort)uVar4 & *(ushort *)dp | (ushort)uVar3;
    }
    else if (uVar5 == 4) {
      *(uint *)dp = ~uVar4 & *(uint *)dp | uVar3;
    }
    return;
  }
  lj_err_caller(cts->L,LJ_ERR_FFI_NYIPACKBIT);
}

Assistant:

void lj_cconv_bf_tv(CTState *cts, CType *d, uint8_t *dp, TValue *o)
{
  CTInfo info = d->info;
  CTSize pos, bsz;
  uint32_t val, mask;
  lj_assertCTS(ctype_isbitfield(info), "bitfield expected");
  if ((info & CTF_BOOL)) {
    uint8_t tmpbool;
    lj_assertCTS(ctype_bitbsz(info) == 1, "bad bool bitfield size");
    lj_cconv_ct_tv(cts, ctype_get(cts, CTID_BOOL), &tmpbool, o, 0);
    val = tmpbool;
  } else {
    CTypeID did = (info & CTF_UNSIGNED) ? CTID_UINT32 : CTID_INT32;
    lj_cconv_ct_tv(cts, ctype_get(cts, did), (uint8_t *)&val, o, 0);
  }
  pos = ctype_bitpos(info);
  bsz = ctype_bitbsz(info);
  lj_assertCTS(pos < 8*ctype_bitcsz(info), "bad bitfield position");
  lj_assertCTS(bsz > 0 && bsz <= 8*ctype_bitcsz(info), "bad bitfield size");
  /* Check if a packed bitfield crosses a container boundary. */
  if (pos + bsz > 8*ctype_bitcsz(info))
    lj_err_caller(cts->L, LJ_ERR_FFI_NYIPACKBIT);
  mask = ((1u << bsz) - 1u) << pos;
  val = (val << pos) & mask;
  /* NYI: packed bitfields may cause misaligned reads/writes. */
  switch (ctype_bitcsz(info)) {
  case 4: *(uint32_t *)dp = (*(uint32_t *)dp & ~mask) | (uint32_t)val; break;
  case 2: *(uint16_t *)dp = (*(uint16_t *)dp & ~mask) | (uint16_t)val; break;
  case 1: *(uint8_t *)dp = (*(uint8_t *)dp & ~mask) | (uint8_t)val; break;
  default:
    lj_assertCTS(0, "bad bitfield container size %d", ctype_bitcsz(info));
    break;
  }
}